

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultiplePixelOffsets::MultiplePixelOffsets
          (MultiplePixelOffsets *this,IVec2 *a,IVec2 *b,IVec2 *c,IVec2 *d)

{
  IVec2 *local_48;
  IVec2 *d_local;
  IVec2 *c_local;
  IVec2 *b_local;
  IVec2 *a_local;
  MultiplePixelOffsets *this_local;
  
  PixelOffsets::PixelOffsets(&this->super_PixelOffsets);
  (this->super_PixelOffsets)._vptr_PixelOffsets = (_func_int **)&PTR_operator___032becc0;
  local_48 = this->m_offsets;
  do {
    tcu::Vector<int,_2>::Vector(local_48);
    local_48 = local_48 + 1;
  } while ((MultiplePixelOffsets *)local_48 != this + 1);
  *(undefined8 *)this->m_offsets[0].m_data = *(undefined8 *)a->m_data;
  *(undefined8 *)this->m_offsets[1].m_data = *(undefined8 *)b->m_data;
  *(undefined8 *)this->m_offsets[2].m_data = *(undefined8 *)c->m_data;
  *(undefined8 *)this->m_offsets[3].m_data = *(undefined8 *)d->m_data;
  return;
}

Assistant:

MultiplePixelOffsets (const IVec2& a,
						  const IVec2& b,
						  const IVec2& c,
						  const IVec2& d)
	{
		m_offsets[0] = a;
		m_offsets[1] = b;
		m_offsets[2] = c;
		m_offsets[3] = d;
	}